

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.c
# Opt level: O0

unsigned_long mbedtls_timing_get_timer(mbedtls_timing_hr_time *val,int reset)

{
  _hr_time *t;
  timeval offset;
  unsigned_long delta;
  int reset_local;
  mbedtls_timing_hr_time *val_local;
  
  gettimeofday((timeval *)&t,(__timezone_ptr_t)0x0);
  if (reset == 0) {
    val_local = (mbedtls_timing_hr_time *)
                (((long)t - *(long *)val->opaque) * 1000 +
                (offset.tv_sec - *(long *)(val->opaque + 8)) / 1000);
  }
  else {
    *(_hr_time **)val->opaque = t;
    *(__time_t *)(val->opaque + 8) = offset.tv_sec;
    val_local = (mbedtls_timing_hr_time *)0x0;
  }
  return (unsigned_long)val_local;
}

Assistant:

unsigned long mbedtls_timing_get_timer( struct mbedtls_timing_hr_time *val, int reset )
{
    unsigned long delta;
    struct timeval offset;
    struct _hr_time *t = (struct _hr_time *) val;

    gettimeofday( &offset, NULL );

    if( reset )
    {
        t->start.tv_sec  = offset.tv_sec;
        t->start.tv_usec = offset.tv_usec;
        return( 0 );
    }

    delta = ( offset.tv_sec  - t->start.tv_sec  ) * 1000
          + ( offset.tv_usec - t->start.tv_usec ) / 1000;

    return( delta );
}